

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *this;
  MatchesClauseSyntax *args_1;
  ConditionalPatternSyntax *pCVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  MatchesClauseSyntax *in_stack_ffffffffffffffd0;
  
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa527d6);
  this = (BumpAllocator *)
         deepClone<slang::syntax::ExpressionSyntax>
                   ((ExpressionSyntax *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(__fn + 0x20) == 0) {
    args_1 = (MatchesClauseSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::MatchesClauseSyntax>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalPatternSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::MatchesClauseSyntax*>
                     (this,(ExpressionSyntax *)__child_stack,(MatchesClauseSyntax **)args_1);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalPatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalPatternSyntax>(
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.matchesClause ? deepClone(*node.matchesClause, alloc) : nullptr
    );
}